

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t helper2(lzma_coder_conflict9 *coder,uint32_t *reps,uint8_t *buf,uint32_t len_end,
                uint32_t position,uint32_t cur,uint32_t nice_len,uint32_t buf_avail_full)

{
  byte bVar1;
  byte bVar2;
  lzma_lzma_state lVar3;
  uint pos_state_00;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint uVar18;
  short *psVar19;
  bool bVar20;
  lzma_lzma_state local_1ac;
  lzma_lzma_state local_1a8;
  uint32_t local_198;
  lzma_lzma_state local_180;
  lzma_lzma_state local_17c;
  uint32_t local_168;
  lzma_lzma_state local_14c;
  lzma_lzma_state local_148;
  uint32_t local_140;
  lzma_lzma_state local_13c;
  uint32_t local_124;
  uint32_t local_120;
  uint32_t local_11c;
  uint32_t local_118;
  lzma_lzma_state state_2_2;
  uint32_t offset_2;
  uint32_t next_rep_match_price_2;
  uint32_t cur_and_len_literal_price_1;
  uint32_t pos_state_next_2;
  uint32_t limit_2;
  uint32_t len_test_2_1;
  uint8_t *buf_back_2;
  uint32_t cur_and_len_price_3;
  uint32_t cur_back;
  uint32_t normal_match_price;
  uint32_t i_2;
  uint32_t len_test_3;
  lzma_lzma_state state_2_1;
  uint32_t cur_and_len_price_2;
  uint32_t offset_1;
  uint32_t next_rep_match_price_1;
  uint32_t cur_and_len_literal_price;
  uint32_t pos_state_next_1;
  uint32_t cur_and_len_price_1;
  uint8_t *buf_back_1;
  uint32_t limit_1;
  uint32_t price;
  uint32_t len_test_temp;
  uint32_t len_test_2;
  uint32_t len_test_1;
  lzma_lzma_state state_2;
  uint32_t cur_and_len_price;
  uint32_t offset;
  uint32_t next_rep_match_price;
  uint32_t pos_state_next;
  uint32_t len_test;
  uint32_t limit;
  uint8_t *buf_back;
  uint local_78;
  uint32_t short_rep_price;
  uint32_t i_1;
  uint32_t pos;
  uint32_t start_len;
  uint32_t rep_match_price;
  uint32_t match_price;
  _Bool next_is_literal;
  uint32_t cur_and_1_price;
  uint32_t pos_state;
  uint8_t match_byte;
  uint uStack_50;
  uint8_t current_byte;
  uint32_t cur_price;
  uint32_t i;
  uint32_t rep_index;
  uint32_t buf_avail;
  lzma_lzma_state state;
  uint32_t pos_prev;
  uint32_t new_len;
  uint32_t matches_count;
  uint32_t cur_local;
  uint32_t position_local;
  uint32_t len_end_local;
  uint8_t *buf_local;
  uint32_t *reps_local;
  lzma_coder_conflict9 *coder_local;
  
  pos_prev = coder->matches_count;
  state = coder->longest_match_length;
  buf_avail = coder->opts[cur].pos_prev;
  i_1 = 2;
  if ((coder->opts[cur].prev_1_is_literal & 1U) == 0) {
    rep_index = coder->opts[buf_avail].state;
  }
  else {
    buf_avail = buf_avail - 1;
    if ((coder->opts[cur].prev_2 & 1U) == 0) {
      rep_index = coder->opts[buf_avail].state;
    }
    else {
      lVar3 = coder->opts[coder->opts[cur].pos_prev_2].state;
      if (coder->opts[cur].back_prev_2 < 4) {
        rep_index = 0xb;
        if (lVar3 < STATE_LIT_MATCH) {
          rep_index = 8;
        }
      }
      else {
        rep_index = 10;
        if (lVar3 < STATE_LIT_MATCH) {
          rep_index = 7;
        }
      }
    }
    if (rep_index < 4) {
      local_118 = 0;
    }
    else {
      if (rep_index < 10) {
        local_11c = rep_index - 3;
      }
      else {
        local_11c = rep_index - 6;
      }
      local_118 = local_11c;
    }
    rep_index = local_118;
  }
  if (buf_avail == cur - 1) {
    if (coder->opts[cur].back_prev == 0) {
      bVar20 = rep_index < 7;
      rep_index = 0xb;
      if (bVar20) {
        rep_index = 9;
      }
    }
    else {
      if (rep_index < 4) {
        local_120 = 0;
      }
      else {
        if (rep_index < 10) {
          local_124 = rep_index - 3;
        }
        else {
          local_124 = rep_index - 6;
        }
        local_120 = local_124;
      }
      rep_index = local_120;
    }
  }
  else {
    if (((coder->opts[cur].prev_1_is_literal & 1U) == 0) || ((coder->opts[cur].prev_2 & 1U) == 0)) {
      short_rep_price = coder->opts[cur].back_prev;
      if (short_rep_price < 4) {
        bVar20 = rep_index < 7;
        rep_index = 0xb;
        if (bVar20) {
          rep_index = 8;
        }
      }
      else {
        bVar20 = rep_index < 7;
        rep_index = 10;
        if (bVar20) {
          rep_index = 7;
        }
      }
    }
    else {
      buf_avail = coder->opts[cur].pos_prev_2;
      short_rep_price = coder->opts[cur].back_prev_2;
      bVar20 = rep_index < 7;
      rep_index = 0xb;
      if (bVar20) {
        rep_index = 8;
      }
    }
    if (short_rep_price < 4) {
      *reps = coder->opts[buf_avail].backs[short_rep_price];
      for (local_78 = 1; local_78 <= short_rep_price; local_78 = local_78 + 1) {
        reps[local_78] = coder->opts[buf_avail].backs[local_78 - 1];
      }
      for (; local_78 < 4; local_78 = local_78 + 1) {
        reps[local_78] = coder->opts[buf_avail].backs[local_78];
      }
    }
    else {
      *reps = short_rep_price - 4;
      for (uStack_50 = 1; uStack_50 < 4; uStack_50 = uStack_50 + 1) {
        reps[uStack_50] = coder->opts[buf_avail].backs[uStack_50 - 1];
      }
    }
  }
  coder->opts[cur].state = rep_index;
  for (uStack_50 = 0; uStack_50 < 4; uStack_50 = uStack_50 + 1) {
    coder->opts[cur].backs[uStack_50] = reps[uStack_50];
  }
  uVar8 = coder->opts[cur].price;
  bVar1 = *buf;
  bVar2 = buf[-1 - (ulong)*reps];
  pos_state_00 = position & coder->pos_mask;
  uVar4 = rc_bit_0_price(coder->is_match[rep_index][pos_state_00]);
  uVar5 = get_literal_price(coder,position,(uint)buf[-1],(_Bool)((rep_index < 7 ^ 0xffU) & 1),
                            (uint)bVar2,(uint)bVar1);
  uVar6 = uVar8 + uVar4 + uVar5;
  rep_match_price._3_1_ = uVar6 < coder->opts[cur + 1].price;
  if (rep_match_price._3_1_) {
    coder->opts[cur + 1].price = uVar6;
    coder->opts[cur + 1].pos_prev = cur;
    make_literal(coder->opts + (cur + 1));
  }
  uVar4 = rc_bit_1_price(coder->is_match[rep_index][pos_state_00]);
  iVar7 = uVar8 + uVar4;
  uVar8 = rc_bit_1_price(coder->is_rep[rep_index]);
  iVar9 = iVar7 + uVar8;
  if ((bVar2 == bVar1) &&
     ((cur <= coder->opts[cur + 1].pos_prev || (coder->opts[cur + 1].back_prev != 0)))) {
    uVar8 = get_short_rep_price(coder,rep_index,pos_state_00);
    uVar10 = iVar9 + uVar8;
    bVar20 = uVar10 <= coder->opts[cur + 1].price;
    if (bVar20) {
      coder->opts[cur + 1].price = uVar10;
      coder->opts[cur + 1].pos_prev = cur;
      make_short_rep(coder->opts + (cur + 1));
    }
    rep_match_price._3_1_ = bVar20 || rep_match_price._3_1_;
  }
  coder_local._4_4_ = len_end;
  if (1 < buf_avail_full) {
    if (buf_avail_full < nice_len) {
      local_13c = buf_avail_full;
    }
    else {
      local_13c = nice_len;
    }
    cur_local = len_end;
    if ((!rep_match_price._3_1_) && (bVar2 != bVar1)) {
      if (buf_avail_full < nice_len + 1) {
        local_140 = buf_avail_full;
      }
      else {
        local_140 = nice_len + 1;
      }
      next_rep_match_price = 1;
      while( true ) {
        bVar20 = false;
        if (next_rep_match_price < local_140) {
          bVar20 = buf[next_rep_match_price] ==
                   buf[(ulong)next_rep_match_price + (-1 - (ulong)*reps)];
        }
        if (!bVar20) break;
        next_rep_match_price = next_rep_match_price + 1;
      }
      uVar10 = next_rep_match_price - 1;
      if (1 < uVar10) {
        if (rep_index < 4) {
          local_148 = STATE_LIT_LIT;
        }
        else {
          if (rep_index < 10) {
            local_14c = rep_index - STATE_SHORTREP_LIT_LIT;
          }
          else {
            local_14c = rep_index - STATE_SHORTREP_LIT;
          }
          local_148 = local_14c;
        }
        uVar11 = position + 1 & coder->pos_mask;
        uVar8 = rc_bit_1_price(coder->is_match[local_148][uVar11]);
        uVar4 = rc_bit_1_price(coder->is_rep[local_148]);
        uVar12 = cur + 1 + uVar10;
        while (cur_local < uVar12) {
          cur_local = cur_local + 1;
          coder->opts[cur_local].price = 0x40000000;
        }
        uVar5 = get_rep_price(coder,0,uVar10,local_148,uVar11);
        uVar6 = uVar6 + uVar8 + uVar4 + uVar5;
        if (uVar6 < coder->opts[uVar12].price) {
          coder->opts[uVar12].price = uVar6;
          coder->opts[uVar12].pos_prev = cur + 1;
          coder->opts[uVar12].back_prev = 0;
          coder->opts[uVar12].prev_1_is_literal = true;
          coder->opts[uVar12].prev_2 = false;
        }
      }
    }
    for (cur_price = 0; cur_price < 4; cur_price = cur_price + 1) {
      psVar19 = (short *)(buf + (-1 - (ulong)reps[cur_price]));
      if (*(short *)buf == *psVar19) {
        len_test_temp = 2;
        while( true ) {
          uVar8 = len_test_temp;
          bVar20 = false;
          if (len_test_temp < local_13c) {
            bVar20 = buf[len_test_temp] == *(uint8_t *)((long)psVar19 + (ulong)len_test_temp);
          }
          if (!bVar20) break;
          len_test_temp = len_test_temp + 1;
        }
        while (cur_local < cur + len_test_temp) {
          cur_local = cur_local + 1;
          coder->opts[cur_local].price = 0x40000000;
        }
        uVar4 = get_pure_rep_price(coder,cur_price,rep_index,pos_state_00);
        iVar13 = iVar9 + uVar4;
        do {
          uVar4 = get_len_price(&coder->rep_len_encoder,len_test_temp,pos_state_00);
          uVar6 = iVar13 + uVar4;
          if (uVar6 < coder->opts[cur + len_test_temp].price) {
            coder->opts[cur + len_test_temp].price = uVar6;
            coder->opts[cur + len_test_temp].pos_prev = cur;
            coder->opts[cur + len_test_temp].back_prev = cur_price;
            coder->opts[cur + len_test_temp].prev_1_is_literal = false;
          }
          len_test_temp = len_test_temp - 1;
        } while (1 < len_test_temp);
        if (cur_price == 0) {
          i_1 = uVar8 + 1;
        }
        price = uVar8 + 1;
        if (buf_avail_full < price + nice_len) {
          local_168 = buf_avail_full;
        }
        else {
          local_168 = price + nice_len;
        }
        while( true ) {
          bVar20 = false;
          if (price < local_168) {
            bVar20 = buf[price] == *(uint8_t *)((long)psVar19 + (ulong)price);
          }
          if (!bVar20) break;
          price = price + 1;
        }
        uVar6 = price - (uVar8 + 1);
        if (1 < uVar6) {
          uVar10 = 0xb;
          if (rep_index < 7) {
            uVar10 = 8;
          }
          uVar11 = coder->pos_mask;
          uVar4 = get_len_price(&coder->rep_len_encoder,uVar8,pos_state_00);
          uVar5 = rc_bit_0_price(coder->is_match[uVar10][position + uVar8 & uVar11]);
          uVar14 = get_literal_price(coder,position + uVar8,(uint)buf[uVar8 - 1],true,
                                     (uint)*(byte *)((long)psVar19 + (ulong)uVar8),(uint)buf[uVar8])
          ;
          if (uVar10 < 4) {
            local_17c = STATE_LIT_LIT;
          }
          else {
            if (uVar10 < 10) {
              local_180 = uVar10 - STATE_SHORTREP_LIT_LIT;
            }
            else {
              local_180 = uVar10 - STATE_SHORTREP_LIT;
            }
            local_17c = local_180;
          }
          uVar10 = position + uVar8 + 1 & coder->pos_mask;
          uVar15 = rc_bit_1_price(coder->is_match[local_17c][uVar10]);
          uVar16 = rc_bit_1_price(coder->is_rep[local_17c]);
          uVar11 = cur + uVar8 + 1 + uVar6;
          while (cur_local < uVar11) {
            cur_local = cur_local + 1;
            coder->opts[cur_local].price = 0x40000000;
          }
          uVar17 = get_rep_price(coder,0,uVar6,local_17c,uVar10);
          uVar6 = iVar13 + uVar4 + uVar5 + uVar14 + uVar15 + uVar16 + uVar17;
          if (uVar6 < coder->opts[uVar11].price) {
            coder->opts[uVar11].price = uVar6;
            coder->opts[uVar11].pos_prev = cur + uVar8 + 1;
            coder->opts[uVar11].back_prev = 0;
            coder->opts[uVar11].prev_1_is_literal = true;
            coder->opts[uVar11].prev_2 = true;
            coder->opts[uVar11].pos_prev_2 = cur;
            coder->opts[uVar11].back_prev_2 = cur_price;
          }
        }
      }
    }
    if (local_13c < state) {
      state = local_13c;
      pos_prev = 0;
      while (coder->matches[pos_prev].len < local_13c) {
        pos_prev = pos_prev + 1;
      }
      coder->matches[pos_prev].len = local_13c;
      pos_prev = pos_prev + 1;
    }
    if (i_1 <= state) {
      cur_back = 0;
      uVar8 = rc_bit_0_price(coder->is_rep[rep_index]);
      while (cur_local < cur + state) {
        cur_local = cur_local + 1;
        coder->opts[cur_local].price = 0x40000000;
      }
      while (coder->matches[cur_back].len < i_1) {
        cur_back = cur_back + 1;
      }
      normal_match_price = i_1;
      do {
        uVar6 = coder->matches[cur_back].dist;
        uVar4 = get_pos_len_price(coder,uVar6,normal_match_price,pos_state_00);
        uVar10 = iVar7 + uVar8 + uVar4;
        if (uVar10 < coder->opts[cur + normal_match_price].price) {
          coder->opts[cur + normal_match_price].price = uVar10;
          coder->opts[cur + normal_match_price].pos_prev = cur;
          coder->opts[cur + normal_match_price].back_prev = uVar6 + 4;
          coder->opts[cur + normal_match_price].prev_1_is_literal = false;
        }
        if (normal_match_price == coder->matches[cur_back].len) {
          pos_state_next_2 = normal_match_price + 1;
          if (buf_avail_full < pos_state_next_2 + nice_len) {
            local_198 = buf_avail_full;
          }
          else {
            local_198 = pos_state_next_2 + nice_len;
          }
          while( true ) {
            bVar20 = false;
            if (pos_state_next_2 < local_198) {
              bVar20 = buf[pos_state_next_2] == buf[(ulong)pos_state_next_2 + (-1 - (ulong)uVar6)];
            }
            if (!bVar20) break;
            pos_state_next_2 = pos_state_next_2 + 1;
          }
          uVar11 = pos_state_next_2 - (normal_match_price + 1);
          if (1 < uVar11) {
            uVar12 = 10;
            if (rep_index < 7) {
              uVar12 = 7;
            }
            uVar18 = position + normal_match_price & coder->pos_mask;
            uVar4 = rc_bit_0_price(coder->is_match[uVar12][uVar18]);
            uVar5 = get_literal_price(coder,position + normal_match_price,
                                      (uint)buf[normal_match_price - 1],true,
                                      (uint)buf[(ulong)normal_match_price + (-1 - (ulong)uVar6)],
                                      (uint)buf[normal_match_price]);
            if (uVar12 < 4) {
              local_1a8 = STATE_LIT_LIT;
            }
            else {
              if (uVar12 < 10) {
                local_1ac = uVar12 - STATE_SHORTREP_LIT_LIT;
              }
              else {
                local_1ac = uVar12 - STATE_SHORTREP_LIT;
              }
              local_1a8 = local_1ac;
            }
            uVar12 = uVar18 + 1 & coder->pos_mask;
            uVar14 = rc_bit_1_price(coder->is_match[local_1a8][uVar12]);
            uVar15 = rc_bit_1_price(coder->is_rep[local_1a8]);
            uVar18 = cur + normal_match_price + 1 + uVar11;
            while (cur_local < uVar18) {
              cur_local = cur_local + 1;
              coder->opts[cur_local].price = 0x40000000;
            }
            uVar16 = get_rep_price(coder,0,uVar11,local_1a8,uVar12);
            uVar10 = uVar10 + uVar4 + uVar5 + uVar14 + uVar15 + uVar16;
            if (uVar10 < coder->opts[uVar18].price) {
              coder->opts[uVar18].price = uVar10;
              coder->opts[uVar18].pos_prev = cur + normal_match_price + 1;
              coder->opts[uVar18].back_prev = 0;
              coder->opts[uVar18].prev_1_is_literal = true;
              coder->opts[uVar18].prev_2 = true;
              coder->opts[uVar18].pos_prev_2 = cur;
              coder->opts[uVar18].back_prev_2 = uVar6 + 4;
            }
          }
          cur_back = cur_back + 1;
          if (cur_back == pos_prev) break;
        }
        normal_match_price = normal_match_price + 1;
      } while( true );
    }
    coder_local._4_4_ = cur_local;
  }
  return coder_local._4_4_;
}

Assistant:

static inline uint32_t
helper2(lzma_coder *coder, uint32_t *reps, const uint8_t *buf,
		uint32_t len_end, uint32_t position, const uint32_t cur,
		const uint32_t nice_len, const uint32_t buf_avail_full)
{
	uint32_t matches_count = coder->matches_count;
	uint32_t new_len = coder->longest_match_length;
	uint32_t pos_prev = coder->opts[cur].pos_prev;
	lzma_lzma_state state;
	uint32_t buf_avail;
	uint32_t rep_index;
	uint32_t i;

	uint32_t cur_price;
	uint8_t current_byte;
	uint8_t match_byte;
	uint32_t pos_state;
	uint32_t cur_and_1_price;
	bool next_is_literal = false;
	uint32_t match_price;
	uint32_t rep_match_price;
	uint32_t start_len = 2;

	if (coder->opts[cur].prev_1_is_literal) {
		--pos_prev;

		if (coder->opts[cur].prev_2) {
			state = coder->opts[coder->opts[cur].pos_prev_2].state;

			if (coder->opts[cur].back_prev_2 < REP_DISTANCES)
				update_long_rep(state);
			else
				update_match(state);

		} else {
			state = coder->opts[pos_prev].state;
		}

		update_literal(state);

	} else {
		state = coder->opts[pos_prev].state;
	}

	if (pos_prev == cur - 1) {
		if (is_short_rep(coder->opts[cur]))
			update_short_rep(state);
		else
			update_literal(state);
	} else {
		uint32_t pos;
		if (coder->opts[cur].prev_1_is_literal
				&& coder->opts[cur].prev_2) {
			pos_prev = coder->opts[cur].pos_prev_2;
			pos = coder->opts[cur].back_prev_2;
			update_long_rep(state);
		} else {
			pos = coder->opts[cur].back_prev;
			if (pos < REP_DISTANCES)
				update_long_rep(state);
			else
				update_match(state);
		}

		if (pos < REP_DISTANCES) {
			uint32_t i;

			reps[0] = coder->opts[pos_prev].backs[pos];

			for (i = 1; i <= pos; ++i)
				reps[i] = coder->opts[pos_prev].backs[i - 1];

			for (; i < REP_DISTANCES; ++i)
				reps[i] = coder->opts[pos_prev].backs[i];

		} else {
			reps[0] = pos - REP_DISTANCES;

			for (i = 1; i < REP_DISTANCES; ++i)
				reps[i] = coder->opts[pos_prev].backs[i - 1];
		}
	}

	coder->opts[cur].state = state;

	for (i = 0; i < REP_DISTANCES; ++i)
		coder->opts[cur].backs[i] = reps[i];

	cur_price = coder->opts[cur].price;

	current_byte = *buf;
	match_byte = *(buf - reps[0] - 1);

	pos_state = position & coder->pos_mask;

	cur_and_1_price = cur_price
			+ rc_bit_0_price(coder->is_match[state][pos_state])
			+ get_literal_price(coder, position, buf[-1],
			!is_literal_state(state), match_byte, current_byte);

	if (cur_and_1_price < coder->opts[cur + 1].price) {
		coder->opts[cur + 1].price = cur_and_1_price;
		coder->opts[cur + 1].pos_prev = cur;
		make_literal(&coder->opts[cur + 1]);
		next_is_literal = true;
	}

	match_price = cur_price
			+ rc_bit_1_price(coder->is_match[state][pos_state]);
	rep_match_price = match_price
			+ rc_bit_1_price(coder->is_rep[state]);

	if (match_byte == current_byte
			&& !(coder->opts[cur + 1].pos_prev < cur
				&& coder->opts[cur + 1].back_prev == 0)) {

		const uint32_t short_rep_price = rep_match_price
				+ get_short_rep_price(coder, state, pos_state);

		if (short_rep_price <= coder->opts[cur + 1].price) {
			coder->opts[cur + 1].price = short_rep_price;
			coder->opts[cur + 1].pos_prev = cur;
			make_short_rep(&coder->opts[cur + 1]);
			next_is_literal = true;
		}
	}

	if (buf_avail_full < 2)
		return len_end;

	buf_avail = my_min(buf_avail_full, nice_len);

	if (!next_is_literal && match_byte != current_byte) { // speed optimization
		// try literal + rep0
		const uint8_t *const buf_back = buf - reps[0] - 1;
		const uint32_t limit = my_min(buf_avail_full, nice_len + 1);

		uint32_t len_test = 1;
		while (len_test < limit && buf[len_test] == buf_back[len_test])
			++len_test;

		--len_test;

		if (len_test >= 2) {
			uint32_t pos_state_next;
			uint32_t next_rep_match_price;
			uint32_t offset;
			uint32_t cur_and_len_price;

			lzma_lzma_state state_2 = state;
			update_literal(state_2);

			pos_state_next = (position + 1) & coder->pos_mask;
			next_rep_match_price = cur_and_1_price
					+ rc_bit_1_price(coder->is_match[state_2][pos_state_next])
					+ rc_bit_1_price(coder->is_rep[state_2]);

			//for (; len_test >= 2; --len_test) {
			offset = cur + 1 + len_test;

			while (len_end < offset)
				coder->opts[++len_end].price = RC_INFINITY_PRICE;

			cur_and_len_price = next_rep_match_price
					+ get_rep_price(coder, 0, len_test,
						state_2, pos_state_next);

			if (cur_and_len_price < coder->opts[offset].price) {
				coder->opts[offset].price = cur_and_len_price;
				coder->opts[offset].pos_prev = cur + 1;
				coder->opts[offset].back_prev = 0;
				coder->opts[offset].prev_1_is_literal = true;
				coder->opts[offset].prev_2 = false;
			}
			//}
		}
	}


	for (rep_index = 0; rep_index < REP_DISTANCES; ++rep_index) {
		uint32_t len_test, len_test_2, len_test_temp;
		uint32_t price, limit;

		const uint8_t *const buf_back = buf - reps[rep_index] - 1;
		if (not_equal_16(buf, buf_back))
			continue;

		for (len_test = 2; len_test < buf_avail
				&& buf[len_test] == buf_back[len_test];
				++len_test) ;

		while (len_end < cur + len_test)
			coder->opts[++len_end].price = RC_INFINITY_PRICE;

		len_test_temp = len_test;
		price = rep_match_price + get_pure_rep_price(
				coder, rep_index, state, pos_state);

		do {
			const uint32_t cur_and_len_price = price
					+ get_len_price(&coder->rep_len_encoder,
							len_test, pos_state);

			if (cur_and_len_price < coder->opts[cur + len_test].price) {
				coder->opts[cur + len_test].price = cur_and_len_price;
				coder->opts[cur + len_test].pos_prev = cur;
				coder->opts[cur + len_test].back_prev = rep_index;
				coder->opts[cur + len_test].prev_1_is_literal = false;
			}
		} while (--len_test >= 2);

		len_test = len_test_temp;

		if (rep_index == 0)
			start_len = len_test + 1;


		len_test_2 = len_test + 1;
		limit = my_min(buf_avail_full,
				len_test_2 + nice_len);
		for (; len_test_2 < limit
				&& buf[len_test_2] == buf_back[len_test_2];
				++len_test_2) ;

		len_test_2 -= len_test + 1;

		if (len_test_2 >= 2) {
			uint32_t pos_state_next;
			uint32_t cur_and_len_literal_price;
			uint32_t next_rep_match_price;
			uint32_t offset;
			uint32_t cur_and_len_price;

			lzma_lzma_state state_2 = state;
			update_long_rep(state_2);

			pos_state_next = (position + len_test) & coder->pos_mask;

			cur_and_len_literal_price = price
					+ get_len_price(&coder->rep_len_encoder,
						len_test, pos_state)
					+ rc_bit_0_price(coder->is_match[state_2][pos_state_next])
					+ get_literal_price(coder, position + len_test,
						buf[len_test - 1], true,
						buf_back[len_test], buf[len_test]);

			update_literal(state_2);

			pos_state_next = (position + len_test + 1) & coder->pos_mask;

			next_rep_match_price = cur_and_len_literal_price
					+ rc_bit_1_price(coder->is_match[state_2][pos_state_next])
					+ rc_bit_1_price(coder->is_rep[state_2]);

			//for(; len_test_2 >= 2; len_test_2--) {
			offset = cur + len_test + 1 + len_test_2;

			while (len_end < offset)
				coder->opts[++len_end].price = RC_INFINITY_PRICE;

			cur_and_len_price = next_rep_match_price
					+ get_rep_price(coder, 0, len_test_2,
						state_2, pos_state_next);

			if (cur_and_len_price < coder->opts[offset].price) {
				coder->opts[offset].price = cur_and_len_price;
				coder->opts[offset].pos_prev = cur + len_test + 1;
				coder->opts[offset].back_prev = 0;
				coder->opts[offset].prev_1_is_literal = true;
				coder->opts[offset].prev_2 = true;
				coder->opts[offset].pos_prev_2 = cur;
				coder->opts[offset].back_prev_2 = rep_index;
			}
			//}
		}
	}


	//for (uint32_t len_test = 2; len_test <= new_len; ++len_test)
	if (new_len > buf_avail) {
		new_len = buf_avail;

		matches_count = 0;
		while (new_len > coder->matches[matches_count].len)
			++matches_count;

		coder->matches[matches_count++].len = new_len;
	}


	if (new_len >= start_len) {
		uint32_t len_test;
		uint32_t i = 0;

		const uint32_t normal_match_price = match_price
				+ rc_bit_0_price(coder->is_rep[state]);

		while (len_end < cur + new_len)
			coder->opts[++len_end].price = RC_INFINITY_PRICE;

		while (start_len > coder->matches[i].len)
			++i;

		for (len_test = start_len; ; ++len_test) {
			const uint32_t cur_back = coder->matches[i].dist;
			uint32_t cur_and_len_price = normal_match_price
					+ get_pos_len_price(coder,
						cur_back, len_test, pos_state);

			if (cur_and_len_price < coder->opts[cur + len_test].price) {
				coder->opts[cur + len_test].price = cur_and_len_price;
				coder->opts[cur + len_test].pos_prev = cur;
				coder->opts[cur + len_test].back_prev
						= cur_back + REP_DISTANCES;
				coder->opts[cur + len_test].prev_1_is_literal = false;
			}

			if (len_test == coder->matches[i].len) {
				// Try Match + Literal + Rep0
				const uint8_t *const buf_back = buf - cur_back - 1;
				uint32_t len_test_2 = len_test + 1;
				const uint32_t limit = my_min(buf_avail_full,
						len_test_2 + nice_len);

				for (; len_test_2 < limit &&
						buf[len_test_2] == buf_back[len_test_2];
						++len_test_2) ;

				len_test_2 -= len_test + 1;

				if (len_test_2 >= 2) {
					uint32_t pos_state_next;
					uint32_t cur_and_len_literal_price;
					uint32_t next_rep_match_price;
					uint32_t offset;

					lzma_lzma_state state_2 = state;
					update_match(state_2);
					pos_state_next = (position + len_test) & coder->pos_mask;

					cur_and_len_literal_price = cur_and_len_price
							+ rc_bit_0_price(
								coder->is_match[state_2][pos_state_next])
							+ get_literal_price(coder,
								position + len_test,
								buf[len_test - 1],
								true,
								buf_back[len_test],
								buf[len_test]);

					update_literal(state_2);
					pos_state_next = (pos_state_next + 1) & coder->pos_mask;

					next_rep_match_price
							= cur_and_len_literal_price
							+ rc_bit_1_price(
								coder->is_match[state_2][pos_state_next])
							+ rc_bit_1_price(coder->is_rep[state_2]);

					// for(; len_test_2 >= 2; --len_test_2) {
					offset = cur + len_test + 1 + len_test_2;

					while (len_end < offset)
						coder->opts[++len_end].price = RC_INFINITY_PRICE;

					cur_and_len_price = next_rep_match_price
							+ get_rep_price(coder, 0, len_test_2,
								state_2, pos_state_next);

					if (cur_and_len_price < coder->opts[offset].price) {
						coder->opts[offset].price = cur_and_len_price;
						coder->opts[offset].pos_prev = cur + len_test + 1;
						coder->opts[offset].back_prev = 0;
						coder->opts[offset].prev_1_is_literal = true;
						coder->opts[offset].prev_2 = true;
						coder->opts[offset].pos_prev_2 = cur;
						coder->opts[offset].back_prev_2
								= cur_back + REP_DISTANCES;
					}
					//}
				}

				if (++i == matches_count)
					break;
			}
		}
	}

	return len_end;
}